

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O2

void anon_unknown.dwarf_111fd::printLogs(void)

{
  int iVar1;
  allocator local_69;
  string local_68;
  string local_48;
  ConsumeResult local_28;
  
  if ((anonymous_namespace)::printLogs()::textlog == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::printLogs()::textlog);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_48,"%S [%d] %m\n",(allocator *)&local_28);
      std::__cxx11::string::string((string *)&local_68,"%Y-%m-%d %H:%M:%S.%N",&local_69);
      binlog::TextOutputStream::TextOutputStream
                (&printLogs::textlog,(ostream *)&std::cerr,&local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(binlog::TextOutputStream::~TextOutputStream,&printLogs::textlog,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::printLogs()::textlog);
    }
  }
  binlog::consume<binlog::TextOutputStream>(&local_28,&printLogs::textlog);
  return;
}

Assistant:

void printLogs()
{
  static binlog::TextOutputStream textlog(std::cerr, "%S [%d] %m\n");
  binlog::consume(textlog);
}